

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjasm.cpp
# Opt level: O3

void Options::COptionsParser::splitByChar
               (char *s,int splitter,char *v1,size_t v1Size,char *v2,size_t v2Size)

{
  char *pcVar1;
  
  if (splitter != 0) {
    pcVar1 = strchr(s,splitter);
    if (pcVar1 != (char *)0x0) {
      strncpy(v1,s,(long)pcVar1 - (long)s);
      v1[(long)pcVar1 - (long)s] = '\0';
      strcpy(v2,pcVar1 + 1);
      return;
    }
  }
  strcpy(v1,s);
  *v2 = '\0';
  return;
}

Assistant:

static void splitByChar(const char* s, const int splitter,
							   char* v1, const size_t v1Size,
							   char* v2, const size_t v2Size) {
			// only non-zero splitter character is supported
			const char* spos = splitter ? STRCHR(s, splitter) : NULL;
			if (NULL == spos) {
				// splitter character not found, copy whole input string into v1, v2 = empty string
				STRCPY(v1, v1Size, s);
				v2[0] = 0;
			} else {
				// splitter found, copy string ahead splitter to v1, after it to v2
				STRNCPY(v1, v1Size, s, spos - s);
				v1[spos - s] = 0;
				STRCPY(v2, v2Size, spos + 1);
			}
		}